

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

BOOL MAPUnmapPEFile(LPCVOID lpAddress)

{
  _LIST_ENTRY *p_Var1;
  _LIST_ENTRY *p_Var2;
  CPalThread *pThread;
  int iVar3;
  PLIST_ENTRY _EX_Flink;
  LIST_ENTRY *pLVar4;
  LIST_ENTRY *pvMem;
  BOOL BVar5;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpAddress == (LPCVOID)0x0) {
      return 0;
    }
    pThread = CorUnix::InternalGetCurrentThread();
    CorUnix::InternalEnterCriticalSection(pThread,&mapping_critsec);
    iVar3 = 0;
    p_Var1 = MappedViewList.Flink;
    pvMem = (LIST_ENTRY *)0x0;
    while (pLVar4 = p_Var1, pLVar4 != &MappedViewList) {
      p_Var1 = pLVar4->Flink;
      if (pLVar4[3].Flink == (_LIST_ENTRY *)lpAddress) {
        iVar3 = iVar3 + 1;
        p_Var2 = pLVar4->Blink;
        p_Var2->Flink = p_Var1;
        p_Var1->Blink = p_Var2;
        pLVar4->Flink = pvMem;
        pvMem = pLVar4;
      }
    }
    if ((iVar3 != 0) || (PAL_InitializeChakraCoreCalled != false)) {
      CorUnix::InternalLeaveCriticalSection(pThread,&mapping_critsec);
      BVar5 = 1;
      while (pvMem != (LIST_ENTRY *)0x0) {
        p_Var1 = pvMem->Flink;
        iVar3 = munmap(pvMem[1].Blink,(size_t)pvMem[2].Flink);
        if ((iVar3 == -1) && (BVar5 = 0, PAL_InitializeChakraCoreCalled == false))
        goto LAB_0032b906;
        p_Var2 = pvMem[1].Flink;
        if (p_Var2 != (_LIST_ENTRY *)0x0) {
          (*(code *)p_Var2->Flink[4].Flink)(p_Var2,pThread);
        }
        CorUnix::InternalFree(pvMem);
        pvMem = p_Var1;
      }
      if (PAL_InitializeChakraCoreCalled != false) {
        return BVar5;
      }
    }
  }
LAB_0032b906:
  abort();
}

Assistant:

BOOL MAPUnmapPEFile(LPCVOID lpAddress)
{
    TRACE_(LOADER)("MAPUnmapPEFile(lpAddress=%p)\n", lpAddress);

    if ( NULL == lpAddress )
    {
        ERROR_(LOADER)( "lpAddress cannot be NULL\n" );
        return FALSE;
    }

    BOOL retval = TRUE;
    CPalThread * pThread = InternalGetCurrentThread();
    InternalEnterCriticalSection(pThread, &mapping_critsec);
    PLIST_ENTRY pLink, pLinkNext, pLinkLocal = NULL;
    unsigned nPESections = 0;

    // Look through the entire MappedViewList for all mappings associated with the
    // PE file with base address 'lpAddress'. We want to unmap all the memory
    // and then release the file mapping object. Unfortunately, based on the comment
    // in CorUnix::InternalUnmapViewOfFile(), we can't release the file mapping object
    // while within the mapping critical section. So, we unlink all the elements from the
    // main list while in the critical section, and then run through this local list
    // doing the real work after releasing the main list critical section. The order
    // of the unmapping doesn't matter, so we don't fully set all the list link pointers,
    // only a minimal set.

    for(pLink = MappedViewList.Flink;
        pLink != &MappedViewList;
        pLink = pLinkNext)
    {
        pLinkNext = pLink->Flink;
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

        if (pView->lpPEBaseAddress == lpAddress) // this entry is associated with the PE file
        {
            ++nPESections; // for debugging, check that we see at least one

            RemoveEntryList(&pView->Link);
            pView->Link.Flink = pLinkLocal; // the local list is singly-linked, NULL terminated
            pLinkLocal = &pView->Link;
        }
    }

#if _DEBUG
    if (nPESections == 0)
    {
        ERROR_(LOADER)( "MAPUnmapPEFile called to unmap a file that was not in the PE file mapping list\n" );
    }
#endif // _DEBUG

    InternalLeaveCriticalSection(pThread, &mapping_critsec);

    // Now, outside the critical section, do the actual unmapping work

    for(pLink = pLinkLocal;
        pLink != NULL;
        pLink = pLinkNext)
    {
        pLinkNext = pLink->Flink;
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

        // remove pView mapping from the list
        if (-1 == munmap(pView->lpAddress, pView->NumberOfBytesToMap))
        {
            // Emit an error message in a trace, but continue trying to do the rest
            ERROR_(LOADER)("Unable to unmap the file. Expect trouble.\n");
            retval = FALSE;
        }

        IPalObject* pFileObject = pView->pFileMapping;
        if (NULL != pFileObject)
        {
            pFileObject->ReleaseReference(pThread);
        }
        InternalFree(pView); // this leaves pLink dangling
    }

    TRACE_(LOADER)("MAPUnmapPEFile returning %d\n", retval);
    return retval;
}